

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.hpp
# Opt level: O3

void __thiscall
ranger::bhvr_tree::
sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,handler_type *hdl)

{
  handler_type *this_00;
  bool local_79;
  function<void(bool,test_agent*)> local_78 [16];
  code *local_68;
  anon_class_56_4_3ec9ec79 local_58;
  
  if (node == (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               *)0x0) {
    local_58.ap = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                   *)ap->m_agent;
    local_79 = true;
    if ((hdl->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*hdl->_M_invoker)((_Any_data *)hdl,&local_79,(test_agent **)&local_58);
  }
  else {
    this_00 = &local_58.hdl;
    local_58.ap = ap;
    std::function<void_(bool,_test_agent_*)>::function(this_00,hdl);
    local_58.this = this;
    local_58.node = node;
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              (local_78,&local_58);
    (*node->_vptr_abstract_node[2])(node,ap,local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(local_78,local_78,3);
    }
    if (local_58.hdl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.hdl.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
  }
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 typename AgentProxy::handler_type hdl) const {
    if (node) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        if (!result) {
          ap(hdl, false);
        } else {
          exec_impl(ap, node->get_next_sibling(), std::move(hdl));
        }
      });
    } else {
      ap(hdl, true);
    }
  }